

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HostAddress_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::HostAddress::operator<(HostAddress *this,HostAddress *other)

{
  NetworkProtocol NVar1;
  NetworkProtocol NVar2;
  int iVar3;
  
  NVar1 = this->m_protocol;
  NVar2 = other->m_protocol;
  if (NVar1 == IPv6Protocol) {
    if (NVar2 == IPv6Protocol) {
      iVar3 = memcmp(&this->m_ip6Address,&other->m_ip6Address,0x10);
      return SUB41((uint)iVar3 >> 0x1f,0);
    }
  }
  else if ((NVar1 == IPv4Protocol) && (NVar2 == IPv4Protocol)) {
    return this->m_ip4Address < other->m_ip4Address;
  }
  return NVar1 < NVar2;
}

Assistant:

bool HostAddress::operator<(const HostAddress& other) const
{

    // if self is IPv4
    if (m_protocol == HostAddress::IPv4Protocol) {
        if (other.m_protocol == HostAddress::IPv4Protocol) {
            return m_ip4Address < other.m_ip4Address;
        }
    }

    // if self is IPv6
    else if (m_protocol == HostAddress::IPv6Protocol) {
        if (other.m_protocol == HostAddress::IPv6Protocol) {
            return (std::memcmp(&m_ip6Address, &other.m_ip6Address, sizeof(IPv6Address)) < 0);
        }
    }

    // otherwise compare protocol types
    return m_protocol < other.m_protocol;
}